

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_object.cpp
# Opt level: O0

void mjs::anon_unknown_33::copy_accessor_methods(object_ptr *dst,object_ptr *src)

{
  reference psVar1;
  vector<mjs::string,_std::allocator<mjs::string>_> *this;
  bool bVar2;
  object *poVar3;
  size_type sVar4;
  object *poVar5;
  wstring_view wVar6;
  bool local_189;
  bool local_159;
  wstring_view local_158;
  value local_148;
  __type_identity_t<basic_string_view<wchar_t,_char_traits<wchar_t>_>_> local_120;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_110;
  __type_identity_t<basic_string_view<wchar_t,_char_traits<wchar_t>_>_> local_100;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_f0;
  __type_identity_t<basic_string_view<wchar_t,_char_traits<wchar_t>_>_> local_e0;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_d0;
  __type_identity_t<basic_string_view<wchar_t,_char_traits<wchar_t>_>_> local_c0;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_b0;
  reference local_a0;
  string *p;
  const_iterator __end2;
  const_iterator __begin2;
  vector<mjs::string,_std::allocator<mjs::string>_> *__range2;
  vector<mjs::string,_std::allocator<mjs::string>_> *local_68;
  vector<mjs::string,_std::allocator<mjs::string>_> *names;
  byte local_39;
  undefined1 local_38 [24];
  wchar_t *local_20;
  gc_heap_ptr_untyped *local_18;
  object_ptr *src_local;
  object_ptr *dst_local;
  
  local_18 = &src->super_gc_heap_ptr_untyped;
  src_local = dst;
  bVar2 = gc_heap_ptr_untyped::operator_cast_to_bool(&dst->super_gc_heap_ptr_untyped);
  local_39 = 0;
  local_159 = false;
  if (bVar2) {
    bVar2 = gc_heap_ptr_untyped::operator_cast_to_bool(local_18);
    local_159 = false;
    if (bVar2) {
      gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_18);
      object::class_name((object *)local_38);
      local_39 = 1;
      join_0x00000010_0x00000000_ = string::view((string *)local_38);
      std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
                ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&names,L"Accessor");
      local_159 = std::operator==(stack0xffffffffffffffd8,_names);
    }
  }
  if (local_159 != false) {
    if ((local_39 & 1) != 0) {
      string::~string((string *)local_38);
    }
    poVar3 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_18);
    object::own_property_names
              ((vector<mjs::string,_std::allocator<mjs::string>_> *)&__range2,poVar3,false);
    local_68 = (vector<mjs::string,_std::allocator<mjs::string>_> *)&__range2;
    sVar4 = std::vector<mjs::string,_std::allocator<mjs::string>_>::size(local_68);
    this = local_68;
    if (sVar4 != 3) {
      __assert_fail("names.size() == 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object_object.cpp"
                    ,0x4b,
                    "void mjs::(anonymous namespace)::copy_accessor_methods(const object_ptr &, const object_ptr &)"
                   );
    }
    __end2 = std::vector<mjs::string,_std::allocator<mjs::string>_>::begin(local_68);
    p = (string *)std::vector<mjs::string,_std::allocator<mjs::string>_>::end(this);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_mjs::string_*,_std::vector<mjs::string,_std::allocator<mjs::string>_>_>
                                  *)&p);
      if (!bVar2) {
        std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector
                  ((vector<mjs::string,_std::allocator<mjs::string>_> *)&__range2);
        return;
      }
      local_a0 = __gnu_cxx::
                 __normal_iterator<const_mjs::string_*,_std::vector<mjs::string,_std::allocator<mjs::string>_>_>
                 ::operator*(&__end2);
      wVar6 = string::view(local_a0);
      local_b0 = wVar6;
      std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
                (&local_c0,L"get");
      bVar2 = std::operator==(local_b0,local_c0);
      local_189 = true;
      if (!bVar2) {
        wVar6 = string::view(local_a0);
        local_d0 = wVar6;
        std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
                  (&local_e0,L"set");
        bVar2 = std::operator==(local_d0,local_e0);
        local_189 = true;
        if (!bVar2) {
          wVar6 = string::view(local_a0);
          local_f0 = wVar6;
          std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
                    (&local_100,L"__strict__");
          local_189 = std::operator==(local_f0,local_100);
        }
      }
      if (local_189 == false) break;
      wVar6 = string::view(local_a0);
      local_110 = wVar6;
      std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
                (&local_120,L"__strict__");
      bVar2 = std::operator==(local_110,local_120);
      if (!bVar2) {
        poVar3 = gc_heap_ptr<mjs::object>::operator->(src_local);
        psVar1 = local_a0;
        poVar5 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_18);
        wVar6 = string::view(local_a0);
        local_158 = wVar6;
        (**poVar5->_vptr_object)(&local_148,poVar5,&local_158);
        (*poVar3->_vptr_object[1])(poVar3,psVar1,&local_148,0);
        value::~value(&local_148);
      }
      __gnu_cxx::
      __normal_iterator<const_mjs::string_*,_std::vector<mjs::string,_std::allocator<mjs::string>_>_>
      ::operator++(&__end2);
    }
    __assert_fail("p.view() == L\"get\" || p.view() == L\"set\" || p.view() == L\"__strict__\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object_object.cpp"
                  ,0x4d,
                  "void mjs::(anonymous namespace)::copy_accessor_methods(const object_ptr &, const object_ptr &)"
                 );
  }
  __assert_fail("dst && src && src->class_name().view() == L\"Accessor\"",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object_object.cpp"
                ,0x49,
                "void mjs::(anonymous namespace)::copy_accessor_methods(const object_ptr &, const object_ptr &)"
               );
}

Assistant:

void copy_accessor_methods(const object_ptr& dst, const object_ptr& src) {
    assert(dst && src && src->class_name().view() == L"Accessor");
    const auto& names = src->own_property_names(false);
    assert(names.size() == 3);
    for (const auto& p: names) {
        assert(p.view() == L"get" || p.view() == L"set" || p.view() == L"__strict__");
        if (p.view() == L"__strict__")continue;
        dst->put(p, src->get(p.view()));
    }
}